

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr2.c
# Opt level: O3

Aig_Man_t * Saig_ManCreateIndMiter(Aig_Man_t *pAig,Vec_Vec_t *vCands)

{
  char *pcVar1;
  void *pvVar2;
  Vec_Ptr_t *pVVar3;
  bool bVar4;
  int iVar5;
  void *__ptr;
  Aig_Man_t *p;
  size_t sVar6;
  char *pcVar7;
  long lVar8;
  Aig_Obj_t *pAVar9;
  Vec_Ptr_t *pVVar10;
  Aig_Obj_t *p1;
  int iVar11;
  uint uVar12;
  long lVar13;
  bool bVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  
  sVar6 = (long)pAig->vObjs->nSize * 2;
  __ptr = calloc(sVar6,8);
  p = Aig_ManStart((int)sVar6);
  pcVar1 = pAig->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar1);
  }
  p->pName = pcVar7;
  pcVar1 = pAig->pSpec;
  iVar15 = 0;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar1);
  }
  p->pSpec = pcVar7;
  pAVar9 = p->pConst1;
  lVar8 = (long)pAig->pConst1->Id * 0x10;
  *(Aig_Obj_t **)((long)__ptr + lVar8) = pAVar9;
  *(Aig_Obj_t **)((long)__ptr + lVar8 + 8) = pAVar9;
  iVar5 = pAig->nRegs;
  iVar11 = pAig->nObjs[2];
  bVar4 = true;
  do {
    bVar14 = bVar4;
    if (iVar5 < iVar11) {
      lVar8 = 0;
      do {
        if (pAig->vCis->nSize <= lVar8) goto LAB_006dc74a;
        pvVar2 = pAig->vCis->pArray[lVar8];
        pAVar9 = Aig_ObjCreateCi(p);
        *(Aig_Obj_t **)((long)__ptr + (long)*(int *)((long)pvVar2 + 0x24) * 0x10 + (long)iVar15 * 8)
             = pAVar9;
        lVar8 = lVar8 + 1;
        iVar5 = pAig->nRegs;
        iVar11 = pAig->nObjs[2];
      } while (lVar8 < iVar11 - iVar5);
    }
    iVar15 = 1;
    bVar4 = false;
  } while (bVar14);
  uVar12 = iVar11 - iVar5;
  pVVar10 = pAig->vCis;
  if ((int)uVar12 < pVVar10->nSize) {
    uVar18 = (ulong)uVar12;
    do {
      if ((int)uVar12 < 0) {
LAB_006dc74a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = pVVar10->pArray[uVar18];
      pAVar9 = Aig_ObjCreateCi(p);
      *(Aig_Obj_t **)((long)__ptr + (long)*(int *)((long)pvVar2 + 0x24) * 0x10) = pAVar9;
      uVar18 = uVar18 + 1;
      pVVar10 = pAig->vCis;
    } while ((int)uVar18 < pVVar10->nSize);
  }
  pVVar10 = pAig->vObjs;
  iVar15 = 0;
  bVar4 = true;
  do {
    lVar8 = (long)iVar15;
    if (0 < pVVar10->nSize) {
      lVar13 = 0;
      do {
        pvVar2 = pVVar10->pArray[lVar13];
        if ((pvVar2 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar2 + 0x18) & 7) - 7)) {
          uVar18 = *(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe;
          if (uVar18 == 0) {
            pAVar9 = (Aig_Obj_t *)0x0;
          }
          else {
            pAVar9 = (Aig_Obj_t *)
                     ((ulong)((uint)*(ulong *)((long)pvVar2 + 8) & 1) ^
                     *(ulong *)((long)__ptr + (long)*(int *)(uVar18 + 0x24) * 0x10 + lVar8 * 8));
          }
          uVar18 = *(ulong *)((long)pvVar2 + 0x10) & 0xfffffffffffffffe;
          if (uVar18 == 0) {
            p1 = (Aig_Obj_t *)0x0;
          }
          else {
            p1 = (Aig_Obj_t *)
                 ((ulong)((uint)*(ulong *)((long)pvVar2 + 0x10) & 1) ^
                 *(ulong *)((long)__ptr + (long)*(int *)(uVar18 + 0x24) * 0x10 + lVar8 * 8));
          }
          pAVar9 = Aig_And(p,pAVar9,p1);
          *(Aig_Obj_t **)((long)__ptr + (long)*(int *)((long)pvVar2 + 0x24) * 0x10 + lVar8 * 8) =
               pAVar9;
          pVVar10 = pAig->vObjs;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 < pVVar10->nSize);
    }
    iVar15 = pAig->nRegs;
    lVar13 = (long)iVar15;
    if (0 < lVar13) {
      pVVar3 = pAig->vCos;
      uVar18 = (ulong)(uint)(pAig->nObjs[3] - iVar15);
      iVar15 = -iVar15;
      do {
        if (((((int)uVar18 < 0) || (pVVar3->nSize <= (int)uVar18)) ||
            (uVar12 = pAig->nObjs[2] + iVar15, (int)uVar12 < 0)) ||
           (pAig->vCis->nSize <= (int)uVar12)) goto LAB_006dc74a;
        uVar16 = *(ulong *)((long)pVVar3->pArray[uVar18] + 8);
        uVar17 = uVar16 & 0xfffffffffffffffe;
        if (uVar17 == 0) {
          uVar16 = 0;
        }
        else {
          uVar16 = (ulong)((uint)uVar16 & 1) ^
                   *(ulong *)((long)__ptr + (long)*(int *)(uVar17 + 0x24) * 0x10 + lVar8 * 8);
        }
        if (bVar4) {
          *(ulong *)((long)__ptr +
                    (long)*(int *)((long)pAig->vCis->pArray[uVar12] + 0x24) * 0x10 + 8) = uVar16;
        }
        uVar18 = uVar18 + 1;
        iVar15 = iVar15 + 1;
        lVar13 = lVar13 + -1;
      } while (lVar13 != 0);
    }
    iVar15 = 1;
    bVar14 = !bVar4;
    bVar4 = false;
    if (bVar14) {
      iVar15 = vCands->nSize;
      if (0 < iVar15) {
        lVar8 = 0;
        do {
          pvVar2 = vCands->pArray[lVar8];
          if (0 < *(int *)((long)pvVar2 + 4)) {
            lVar13 = 0;
            do {
              uVar18 = *(ulong *)(*(long *)((long)pvVar2 + 8) + lVar13 * 8);
              iVar15 = *(int *)((uVar18 & 0xfffffffffffffffe) + 0x24);
              uVar18 = (ulong)((uint)uVar18 & 1);
              pAVar9 = Aig_And(p,(Aig_Obj_t *)
                                 (*(ulong *)((long)__ptr + (long)iVar15 * 0x10) ^ uVar18),
                               (Aig_Obj_t *)
                               (uVar18 ^ *(ulong *)((long)__ptr + (long)(iVar15 * 2 + 1) * 8) ^ 1));
              Aig_ObjCreateCo(p,pAVar9);
              lVar13 = lVar13 + 1;
            } while (lVar13 < *(int *)((long)pvVar2 + 4));
            iVar15 = vCands->nSize;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < iVar15);
      }
      Aig_ManCleanup(p);
      if (__ptr != (void *)0x0) {
        free(__ptr);
      }
      return p;
    }
  } while( true );
}

Assistant:

Aig_Man_t * Saig_ManCreateIndMiter( Aig_Man_t * pAig, Vec_Vec_t * vCands )
{
    int nFrames = 2;
    Vec_Ptr_t * vNodes;
    Aig_Man_t * pFrames;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo, * pObjNew;
    Aig_Obj_t ** pObjMap;
    int i, f, k;

    // create mapping for the frames nodes
    pObjMap  = ABC_CALLOC( Aig_Obj_t *, nFrames * Aig_ManObjNumMax(pAig) );

    // start the fraig package
    pFrames = Aig_ManStart( Aig_ManObjNumMax(pAig) * nFrames );
    pFrames->pName = Abc_UtilStrsav( pAig->pName );
    pFrames->pSpec = Abc_UtilStrsav( pAig->pSpec );
    // map constant nodes
    for ( f = 0; f < nFrames; f++ )
        Aig_ObjSetFrames( pObjMap, nFrames, Aig_ManConst1(pAig), f, Aig_ManConst1(pFrames) );
    // create PI nodes for the frames
    for ( f = 0; f < nFrames; f++ )
        Aig_ManForEachPiSeq( pAig, pObj, i )
            Aig_ObjSetFrames( pObjMap, nFrames, pObj, f, Aig_ObjCreateCi(pFrames) );
    // set initial state for the latches
    Aig_ManForEachLoSeq( pAig, pObj, i )
        Aig_ObjSetFrames( pObjMap, nFrames, pObj, 0, Aig_ObjCreateCi(pFrames) );

    // add timeframes
    for ( f = 0; f < nFrames; f++ )
    {
        // add internal nodes of this frame
        Aig_ManForEachNode( pAig, pObj, i )
        {
            pObjNew = Aig_And( pFrames, Aig_ObjChild0Frames(pObjMap,nFrames,pObj,f), Aig_ObjChild1Frames(pObjMap,nFrames,pObj,f) );
            Aig_ObjSetFrames( pObjMap, nFrames, pObj, f, pObjNew );
        }
        // set the latch inputs and copy them into the latch outputs of the next frame
        Aig_ManForEachLiLoSeq( pAig, pObjLi, pObjLo, i )
        {
            pObjNew = Aig_ObjChild0Frames(pObjMap,nFrames,pObjLi,f);
            if ( f < nFrames - 1 )
                Aig_ObjSetFrames( pObjMap, nFrames, pObjLo, f+1, pObjNew );
        }
    }

    // go through the candidates
    Vec_VecForEachLevel( vCands, vNodes, i )
    {
        Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, k )
        {
            Aig_Obj_t * pObjR  = Aig_Regular(pObj);
            Aig_Obj_t * pNode0 = pObjMap[nFrames*Aig_ObjId(pObjR)+0];
            Aig_Obj_t * pNode1 = pObjMap[nFrames*Aig_ObjId(pObjR)+1];
            Aig_Obj_t * pFan0  = Aig_NotCond( pNode0,  Aig_IsComplement(pObj) );
            Aig_Obj_t * pFan1  = Aig_NotCond( pNode1, !Aig_IsComplement(pObj) );
            Aig_Obj_t * pMiter = Aig_And( pFrames, pFan0, pFan1 );
            Aig_ObjCreateCo( pFrames, pMiter );
        }
    }
    Aig_ManCleanup( pFrames );
    ABC_FREE( pObjMap );

//Aig_ManShow( pAig, 0, NULL );
//Aig_ManShow( pFrames, 0, NULL );
    return pFrames;
}